

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::FunctionalTest::FunctionalTest
          (FunctionalTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"framebuffers_renderbuffers_functional",
             "Functional Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_020e54d0;
  this->m_fbo_1st = 0;
  this->m_fbo_2nd = 0;
  this->m_rbo_color = 0;
  this->m_rbo_depth_stencil = 0;
  this->m_to_color = 0;
  this->m_po = 0;
  this->m_vao_stencil_pass_quad = 0;
  this->m_vao_depth_pass_quad = 0;
  this->m_vao_color_pass_quad = 0;
  this->m_bo_stencil_pass_quad = 0;
  this->m_bo_depth_pass_quad = 0;
  this->m_bo_color_pass_quad = 0;
  return;
}

Assistant:

FunctionalTest::FunctionalTest(deqp::Context& context)
	: deqp::TestCase(context, "framebuffers_renderbuffers_functional", "Functional Test")
	, m_fbo_1st(0)
	, m_fbo_2nd(0)
	, m_rbo_color(0)
	, m_rbo_depth_stencil(0)
	, m_to_color(0)
	, m_po(0)
	, m_vao_stencil_pass_quad(0)
	, m_vao_depth_pass_quad(0)
	, m_vao_color_pass_quad(0)
	, m_bo_stencil_pass_quad(0)
	, m_bo_depth_pass_quad(0)
	, m_bo_color_pass_quad(0)
{
	/* Intentionally left blank. */
}